

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compoundfile.hpp
# Opt level: O0

SAT * CompoundFile::loadSSAT(Header *header,istream *stream,SAT *sat)

{
  bool bVar1;
  int32_t iVar2;
  SecID SVar3;
  vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> *in_RCX;
  fpos<__mbstate_t> *in_RDX;
  Header *in_RSI;
  SAT *in_RDI;
  const_iterator last;
  const_iterator it;
  vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> chain;
  vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> ssat;
  SecID *in_stack_00000110;
  SAT *in_stack_00000118;
  fpos<__mbstate_t> *in_stack_ffffffffffffff18;
  fpos<__mbstate_t> *in_stack_ffffffffffffff20;
  vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> *in_stack_ffffffffffffff30;
  vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> *sat_00;
  undefined4 in_stack_ffffffffffffff40;
  undefined8 local_a0;
  undefined8 local_98;
  __normal_iterator<const_CompoundFile::SecID_*,_std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>_>
  local_78;
  int32_t local_6c;
  SecID local_3c [7];
  vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> *local_20;
  fpos<__mbstate_t> *local_18;
  Header *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>::vector
            ((vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> *)0x130ee1);
  local_3c[0] = Header::ssatFirstSecID(local_10);
  iVar2 = SecID::operator_cast_to_int(local_3c);
  if (iVar2 != -2) {
    SVar3 = Header::ssatFirstSecID(local_10);
    local_6c = SVar3.m_id;
    SAT::sectors(in_stack_00000118,in_stack_00000110);
    std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>::begin
              ((vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> *)
               in_stack_ffffffffffffff18);
    __gnu_cxx::
    __normal_iterator<CompoundFile::SecID_const*,std::vector<CompoundFile::SecID,std::allocator<CompoundFile::SecID>>>
    ::__normal_iterator<CompoundFile::SecID*>
              ((__normal_iterator<const_CompoundFile::SecID_*,_std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>_>
                *)in_stack_ffffffffffffff20,
               (__normal_iterator<CompoundFile::SecID_*,_std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>_>
                *)in_stack_ffffffffffffff18);
    std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>::end
              ((vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> *)
               in_stack_ffffffffffffff18);
    __gnu_cxx::
    __normal_iterator<CompoundFile::SecID_const*,std::vector<CompoundFile::SecID,std::allocator<CompoundFile::SecID>>>
    ::__normal_iterator<CompoundFile::SecID*>
              ((__normal_iterator<const_CompoundFile::SecID_*,_std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>_>
                *)in_stack_ffffffffffffff20,
               (__normal_iterator<CompoundFile::SecID_*,_std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>_>
                *)in_stack_ffffffffffffff18);
    sat_00 = local_20;
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_CompoundFile::SecID_*,_std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>_>
                          *)in_stack_ffffffffffffff20,
                         (__normal_iterator<const_CompoundFile::SecID_*,_std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>_>
                          *)in_stack_ffffffffffffff18);
      if (!bVar1) break;
      in_stack_ffffffffffffff20 = local_18;
      __gnu_cxx::
      __normal_iterator<const_CompoundFile::SecID_*,_std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>_>
      ::operator*(&local_78);
      Header::sectorSize(local_10);
      in_stack_ffffffffffffff30 =
           (vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> *)
           calcFileOffset((SecID *)in_stack_ffffffffffffff20,(size_t)in_stack_ffffffffffffff18);
      std::fpos<__mbstate_t>::fpos(in_stack_ffffffffffffff20,(streamoff)in_stack_ffffffffffffff18);
      std::istream::seekg(in_stack_ffffffffffffff20,local_a0,local_98);
      in_stack_ffffffffffffff18 = local_18;
      Header::sectorSize(local_10);
      loadSATSector((istream *)CONCAT44(SVar3.m_id,in_stack_ffffffffffffff40),sat_00,
                    (int32_t)((ulong)in_stack_ffffffffffffff30 >> 0x20));
      __gnu_cxx::
      __normal_iterator<const_CompoundFile::SecID_*,_std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>_>
      ::operator++(&local_78);
    }
    std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>::~vector
              (in_stack_ffffffffffffff30);
  }
  SAT::SAT((SAT *)in_stack_ffffffffffffff20,
           (vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> *)
           in_stack_ffffffffffffff18);
  std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>::~vector
            (in_stack_ffffffffffffff30);
  return in_RDI;
}

Assistant:

inline SAT
loadSSAT( const Header & header, std::istream & stream,
	const SAT & sat )
{
	std::vector< SecID > ssat;

	if( header.ssatFirstSecID() != SecID::EndOfChain )
	{
		std::vector< SecID > chain = sat.sectors( header.ssatFirstSecID() );

		for( std::vector< SecID >::const_iterator it = chain.begin(),
			last = chain.end(); it != last; ++it )
		{
			stream.seekg( calcFileOffset( *it, header.sectorSize() ) );

			loadSATSector( stream, ssat, header.sectorSize() );
		}
	}

	return SAT( ssat );
}